

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.cpp
# Opt level: O0

bool Grammar::is_integer_value(string *str)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  ulong uVar5;
  ulong in_RDI;
  int i;
  bool local_19;
  int local_14;
  bool local_1;
  
  lVar3 = std::__cxx11::string::size();
  if (lVar3 == 0) {
    local_1 = false;
  }
  else {
    pcVar4 = (char *)std::__cxx11::string::operator[](in_RDI);
    bVar1 = str_utils::is_numeric(*pcVar4);
    if (((!bVar1) && (pcVar4 = (char *)std::__cxx11::string::operator[](in_RDI), *pcVar4 != '+')) &&
       (pcVar4 = (char *)std::__cxx11::string::operator[](in_RDI), *pcVar4 != '-')) {
      return false;
    }
    for (local_14 = 1; iVar2 = std::__cxx11::string::size(), local_14 < iVar2;
        local_14 = local_14 + 1) {
      pcVar4 = (char *)std::__cxx11::string::operator[](in_RDI);
      bVar1 = str_utils::is_numeric(*pcVar4);
      if (!bVar1) {
        return false;
      }
    }
    pcVar4 = (char *)std::__cxx11::string::operator[](in_RDI);
    bVar1 = str_utils::is_numeric(*pcVar4);
    local_19 = true;
    if (!bVar1) {
      uVar5 = std::__cxx11::string::size();
      local_19 = 1 < uVar5;
    }
    local_1 = local_19;
  }
  return local_1;
}

Assistant:

bool Grammar::is_integer_value(const std::string& str) {
    if (str.size() == 0)
        return false;
    if (!str_utils::is_numeric(str[0]) && str[0] != '+' && str[0] != '-')
        return false;
    for (int i = 1; i < int(str.size()); i++)
        if (!str_utils::is_numeric(str[i]))
            return false;
    return str_utils::is_numeric(str[0]) || str.size() > 1;
}